

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O1

v256 * v256_ziphi_16(v256 a,v256 b)

{
  v256 *in_RDI;
  
  *(undefined2 *)in_RDI->val[1] = (undefined2)b.val[1][1];
  *(undefined2 *)((long)in_RDI->val[1] + 2) = (undefined2)a.val[1][1];
  *(undefined2 *)((long)in_RDI->val[1] + 4) = b.val[1][1]._2_2_;
  *(undefined2 *)((long)in_RDI->val[1] + 6) = a.val[1][1]._2_2_;
  *(undefined2 *)(in_RDI->val[1] + 1) = b.val[1][1]._4_2_;
  *(undefined2 *)((long)in_RDI->val[1] + 10) = a.val[1][1]._4_2_;
  *(undefined2 *)((long)in_RDI->val[1] + 0xc) = b.val[1][1]._6_2_;
  *(undefined2 *)((long)in_RDI->val[1] + 0xe) = a.val[1][1]._6_2_;
  *(undefined2 *)in_RDI->val[0] = (undefined2)b.val[1][0];
  *(undefined2 *)((long)in_RDI->val[0] + 2) = (undefined2)a.val[1][0];
  *(undefined2 *)((long)in_RDI->val[0] + 4) = b.val[1][0]._2_2_;
  *(undefined2 *)((long)in_RDI->val[0] + 6) = a.val[1][0]._2_2_;
  *(undefined2 *)(in_RDI->val[0] + 1) = b.val[1][0]._4_2_;
  *(undefined2 *)((long)in_RDI->val[0] + 10) = a.val[1][0]._4_2_;
  *(undefined2 *)((long)in_RDI->val[0] + 0xc) = b.val[1][0]._6_2_;
  *(undefined2 *)((long)in_RDI->val[0] + 0xe) = a.val[1][0]._6_2_;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_ziphi_16(v256 a, v256 b) {
  return v256_from_v128(v128_ziphi_16(a.val[1], b.val[1]),
                        v128_ziplo_16(a.val[1], b.val[1]));
}